

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Fad<double> *pFVar5;
  FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_> *this_00;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar6;
  double *pdVar7;
  value_type vVar8;
  double dVar9;
  
  pFVar5 = this->left_;
  pdVar7 = &pFVar5->defaultVal;
  if ((pFVar5->dx_).num_elts != 0) {
    pdVar7 = (pFVar5->dx_).ptr_to_data + i;
  }
  this_00 = &this->right_->fadexpr_;
  dVar1 = ((this_00->right_->fadexpr_).left_)->val_;
  dVar2 = ((this_00->right_->fadexpr_).right_)->val_;
  dVar3 = this_00->left_->val_;
  dVar4 = *pdVar7;
  vVar8 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>::dx
                    (this_00,i);
  pFVar6 = (this->right_->fadexpr_).right_;
  dVar9 = (((pFVar6->fadexpr_).left_)->val_ + ((pFVar6->fadexpr_).right_)->val_) *
          ((this->right_->fadexpr_).left_)->val_;
  return ((dVar1 + dVar2) * dVar3 * dVar4 - vVar8 * this->left_->val_) / (dVar9 * dVar9);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}